

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O1

void M2TSStreamInfo::blurayStreamParams
               (double fps,bool interlaced,uint width,uint height,VideoAspectRatio ar,
               uint8_t *video_format,uint8_t *frame_rate_index,uint8_t *aspect_ratio_index)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  uint8_t uVar4;
  
  bVar3 = false;
  *video_format = '\0';
  *frame_rate_index = '\0';
  *aspect_ratio_index = '\x03';
  if (height < 0x1e1 && width < 0x357) {
    if (0.5 <= ABS(25.0 - fps)) {
      bVar3 = 0.5 <= ABS(50.0 - fps);
    }
    else {
      bVar3 = false;
    }
  }
  if (height < 0x241 && width < 0x401) {
    bVar1 = true;
    if (0.5 <= ABS(25.0 - fps)) {
      bVar1 = ABS(50.0 - fps) < 0.5;
    }
  }
  else {
    bVar1 = false;
  }
  if (bVar3) {
    bVar2 = !interlaced * '\x02' + 1;
  }
  else if (bVar1) {
    bVar2 = !interlaced * '\x05' + 2;
  }
  else {
    bVar2 = 8;
    if (width < 0xa28) {
      bVar2 = 5;
      if (0x513 < width) {
        bVar2 = !interlaced * '\x02' | 4;
      }
    }
  }
  *video_format = bVar2;
  if (width < 0x438) {
    bVar3 = isV3();
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Warning: video height < 1080 is not standard for V3 Blu-ray.",0x3c);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      sLastMsg = true;
    }
  }
  if (interlaced) {
    bVar3 = isV3();
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Warning: interlaced video is not standard for V3 Blu-ray.",
                 0x39);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      sLastMsg = true;
    }
  }
  uVar4 = '\x01';
  if ((((ABS(fps + -23.976) < 0.0001) || (uVar4 = '\x02', ABS(fps + -24.0) < 0.0001)) ||
      (uVar4 = '\x03', ABS(fps + -25.0) < 0.0001)) ||
     (((uVar4 = '\x04', ABS(fps + -29.97) < 0.0001 || (uVar4 = '\x06', ABS(fps + -50.0) < 0.0001))
      || (uVar4 = '\a', ABS(fps + -59.94) < 0.0001)))) {
    *frame_rate_index = uVar4;
  }
  if (ar - AR_VGA < 2) {
    *aspect_ratio_index = '\x02';
  }
  return;
}

Assistant:

void M2TSStreamInfo::blurayStreamParams(const double fps, const bool interlaced, const unsigned width,
                                        const unsigned height, const VideoAspectRatio ar, uint8_t* video_format,
                                        uint8_t* frame_rate_index, uint8_t* aspect_ratio_index)
{
    *video_format = 0;
    *frame_rate_index = 0;
    *aspect_ratio_index = 3;  // 16:9; 2 = 4:3

    const bool isNtsc = width <= 854 && height <= 480 && (fabs(25 - fps) >= 0.5 && fabs(50 - fps) >= 0.5);
    const bool isPal = width <= 1024 && height <= 576 && (fabs(25 - fps) < 0.5 || fabs(50 - fps) < 0.5);
    if (isNtsc)
        *video_format = interlaced ? 1 : 3;
    else if (isPal)
        *video_format = interlaced ? 2 : 7;
    else if (width >= 2600)
        *video_format = 8;
    else if (width >= 1300)
        *video_format = interlaced ? 4 : 6;  // as 1920x1080
    else
        *video_format = 5;  // as 1280x720

    if (width < 1080 && isV3())
        LTRACE(LT_WARN, 2, "Warning: video height < 1080 is not standard for V3 Blu-ray.");
    if (interlaced && isV3())
        LTRACE(LT_WARN, 2, "Warning: interlaced video is not standard for V3 Blu-ray.");

    if (fabs(fps - 23.976) < 1e-4)
        *frame_rate_index = 1;
    else if (fabs(fps - 24.0) < 1e-4)
        *frame_rate_index = 2;
    else if (fabs(fps - 25.0) < 1e-4)
        *frame_rate_index = 3;
    else if (fabs(fps - 29.97) < 1e-4)
        *frame_rate_index = 4;
    else if (fabs(fps - 50.0) < 1e-4)
        *frame_rate_index = 6;
    else if (fabs(fps - 59.94) < 1e-4)
        *frame_rate_index = 7;

    if (ar == VideoAspectRatio::AR_3_4 || ar == VideoAspectRatio::AR_VGA)
        *aspect_ratio_index = 2;  // 4x3
}